

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_adder_forest(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [32];
  ushort uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t i_1;
  long lVar10;
  uint16_t *puVar11;
  int j_1;
  ulong uVar12;
  ulong uVar13;
  size_t i;
  uint32_t uVar14;
  long lVar15;
  int j;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  uint16_t tmp [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x20) {
    *(undefined8 *)(local_440 + lVar10) = 0;
    *(undefined8 *)(local_440 + lVar10 + 8) = 0;
    *(undefined8 *)(local_440 + lVar10 + 0x10) = 0;
    *(undefined8 *)(local_440 + lVar10 + 0x18) = 0;
  }
  auVar44[8] = 0x55;
  auVar44._0_8_ = 0x5555555555555555;
  auVar44[9] = 0x55;
  auVar44[10] = 0x55;
  auVar44[0xb] = 0x55;
  auVar44[0xc] = 0x55;
  auVar44[0xd] = 0x55;
  auVar44[0xe] = 0x55;
  auVar44[0xf] = 0x55;
  auVar44[0x10] = 0x55;
  auVar44[0x11] = 0x55;
  auVar44[0x12] = 0x55;
  auVar44[0x13] = 0x55;
  auVar44[0x14] = 0x55;
  auVar44[0x15] = 0x55;
  auVar44[0x16] = 0x55;
  auVar44[0x17] = 0x55;
  auVar44[0x18] = 0x55;
  auVar44[0x19] = 0x55;
  auVar44[0x1a] = 0x55;
  auVar44[0x1b] = 0x55;
  auVar44[0x1c] = 0x55;
  auVar44[0x1d] = 0x55;
  auVar44[0x1e] = 0x55;
  auVar44[0x1f] = 0x55;
  auVar45[8] = 0x33;
  auVar45._0_8_ = 0x3333333333333333;
  auVar45[9] = 0x33;
  auVar45[10] = 0x33;
  auVar45[0xb] = 0x33;
  auVar45[0xc] = 0x33;
  auVar45[0xd] = 0x33;
  auVar45[0xe] = 0x33;
  auVar45[0xf] = 0x33;
  auVar45[0x10] = 0x33;
  auVar45[0x11] = 0x33;
  auVar45[0x12] = 0x33;
  auVar45[0x13] = 0x33;
  auVar45[0x14] = 0x33;
  auVar45[0x15] = 0x33;
  auVar45[0x16] = 0x33;
  auVar45[0x17] = 0x33;
  auVar45[0x18] = 0x33;
  auVar45[0x19] = 0x33;
  auVar45[0x1a] = 0x33;
  auVar45[0x1b] = 0x33;
  auVar45[0x1c] = 0x33;
  auVar45[0x1d] = 0x33;
  auVar45[0x1e] = 0x33;
  auVar45[0x1f] = 0x33;
  auVar46[8] = 7;
  auVar46._0_8_ = 0x707070707070707;
  auVar46[9] = 7;
  auVar46[10] = 7;
  auVar46[0xb] = 7;
  auVar46[0xc] = 7;
  auVar46[0xd] = 7;
  auVar46[0xe] = 7;
  auVar46[0xf] = 7;
  auVar46[0x10] = 7;
  auVar46[0x11] = 7;
  auVar46[0x12] = 7;
  auVar46[0x13] = 7;
  auVar46[0x14] = 7;
  auVar46[0x15] = 7;
  auVar46[0x16] = 7;
  auVar46[0x17] = 7;
  auVar46[0x18] = 7;
  auVar46[0x19] = 7;
  auVar46[0x1a] = 7;
  auVar46[0x1b] = 7;
  auVar46[0x1c] = 7;
  auVar46[0x1d] = 7;
  auVar46[0x1e] = 7;
  auVar46[0x1f] = 7;
  uVar3 = len >> 0x14;
  puVar11 = array + 0xf0;
  for (uVar12 = 0; uVar12 != uVar3; uVar12 = uVar12 + 1) {
    auVar16 = vmovdqa64_avx512vl(local_440);
    auVar17 = vmovdqa64_avx512vl(local_420);
    auVar18 = vmovdqa64_avx512vl(local_400);
    auVar19 = vmovdqa64_avx512vl(local_3c0);
    auVar20 = vmovdqa64_avx512vl(local_3a0);
    auVar21 = vmovdqa64_avx512vl(local_380);
    lVar10 = 0;
    while (lVar10 != 0x200000) {
      auVar33 = *(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x1e0);
      auVar50 = *(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x1c0);
      auVar48 = *(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x1a0);
      auVar52 = *(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x180);
      auVar49 = *(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x160);
      auVar36 = *(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x140);
      auVar37 = *(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x120);
      auVar38 = *(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x100);
      auVar21 = vmovdqa64_avx512vl(auVar21);
      auVar20 = vmovdqa64_avx512vl(auVar20);
      auVar22 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar11 + lVar10 + -0xe0));
      auVar23 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar11 + lVar10 + -0xc0));
      auVar19 = vmovdqa64_avx512vl(auVar19);
      auVar24 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar11 + lVar10 + -0xa0));
      auVar25 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x80));
      auVar26 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x60));
      auVar27 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x40));
      auVar28 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar11 + lVar10 + -0x20));
      auVar29 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar11 + lVar10));
      auVar17 = vmovdqa64_avx512vl(auVar17);
      auVar18 = vmovdqa64_avx512vl(auVar18);
      local_240 = vmovdqa64_avx512vl(auVar16);
      lVar10 = lVar10 + 0x200;
      auVar16 = vpand_avx2(auVar33,auVar44);
      auVar53 = vpand_avx2(auVar50,auVar44);
      auVar47 = vpsrlw_avx2(auVar33,1);
      auVar51 = vpsrlw_avx2(auVar50,1);
      auVar30 = vpandq_avx512vl(auVar27,auVar44);
      auVar31 = vpaddb_avx512vl(auVar53,auVar16);
      auVar16 = vpand_avx2(auVar48,auVar44);
      auVar33 = vpand_avx2(auVar52,auVar44);
      auVar50 = vpand_avx2(auVar47,auVar44);
      auVar53 = vpand_avx2(auVar51,auVar44);
      auVar47 = vpaddb_avx512vl(auVar33,auVar16);
      auVar16 = vpand_avx2(auVar49,auVar44);
      auVar33 = vpand_avx2(auVar36,auVar44);
      auVar51 = vpaddb_avx512vl(auVar33,auVar16);
      auVar16 = vpand_avx2(auVar37,auVar44);
      auVar33 = vpand_avx2(auVar38,auVar44);
      auVar32 = vpaddb_avx512vl(auVar33,auVar16);
      auVar16 = vpandq_avx512vl(auVar22,auVar44);
      auVar33 = vpandq_avx512vl(auVar23,auVar44);
      auVar34 = vpaddb_avx512vl(auVar33,auVar16);
      auVar16 = vpandq_avx512vl(auVar24,auVar44);
      auVar33 = vpandq_avx512vl(auVar25,auVar44);
      auVar16 = vpaddb_avx2(auVar33,auVar16);
      auVar33 = vpandq_avx512vl(auVar26,auVar44);
      auVar30 = vpaddb_avx512vl(auVar30,auVar33);
      auVar33 = vpandq_avx512vl(auVar28,auVar44);
      auVar35 = vpandq_avx512vl(auVar29,auVar44);
      auVar33 = vpaddb_avx2(auVar35,auVar33);
      auVar50 = vpaddb_avx2(auVar53,auVar50);
      auVar48 = vpsrlw_avx2(auVar48,1);
      auVar52 = vpsrlw_avx2(auVar52,1);
      auVar48 = vpand_avx2(auVar48,auVar44);
      auVar52 = vpand_avx2(auVar52,auVar44);
      auVar48 = vpaddb_avx2(auVar52,auVar48);
      auVar53 = vpsrlw_avx2(auVar36,1);
      auVar52 = vpsrlw_avx2(auVar49,1);
      auVar36 = vpsrlw_avx512vl(auVar47,2);
      auVar52 = vpand_avx2(auVar52,auVar44);
      auVar49 = vpand_avx2(auVar53,auVar44);
      auVar53 = vpand_avx2(auVar36,auVar45);
      auVar52 = vpaddb_avx2(auVar49,auVar52);
      auVar49 = vpsrlw_avx2(auVar37,1);
      auVar36 = vpsrlw_avx2(auVar38,1);
      auVar49 = vpand_avx2(auVar49,auVar44);
      auVar36 = vpand_avx2(auVar36,auVar44);
      auVar49 = vpaddb_avx2(auVar36,auVar49);
      auVar36 = vpsrlw_avx512vl(auVar22,1);
      auVar37 = vpsrlw_avx512vl(auVar23,1);
      auVar38 = vpsrlw_avx512vl(auVar32,2);
      auVar36 = vpand_avx2(auVar36,auVar44);
      auVar37 = vpand_avx2(auVar37,auVar44);
      auVar35 = vpandq_avx512vl(auVar38,auVar45);
      auVar36 = vpaddb_avx2(auVar37,auVar36);
      auVar37 = vpsrlw_avx512vl(auVar24,1);
      auVar38 = vpsrlw_avx512vl(auVar25,1);
      auVar37 = vpand_avx2(auVar37,auVar44);
      auVar38 = vpand_avx2(auVar38,auVar44);
      auVar24 = vpaddb_avx512vl(auVar38,auVar37);
      auVar37 = vpsrlw_avx512vl(auVar26,1);
      auVar38 = vpsrlw_avx512vl(auVar27,1);
      auVar37 = vpand_avx2(auVar37,auVar44);
      auVar38 = vpand_avx2(auVar38,auVar44);
      auVar25 = vpandq_avx512vl(auVar24,auVar45);
      auVar26 = vpaddb_avx512vl(auVar38,auVar37);
      auVar37 = vpsrlw_avx512vl(auVar28,1);
      auVar38 = vpsrlw_avx512vl(auVar29,1);
      auVar37 = vpand_avx2(auVar37,auVar44);
      auVar38 = vpand_avx2(auVar38,auVar44);
      auVar27 = vpaddb_avx512vl(auVar38,auVar37);
      auVar37 = vpandq_avx512vl(auVar31,auVar45);
      auVar38 = vpandq_avx512vl(auVar47,auVar45);
      auVar28 = vpaddb_avx512vl(auVar38,auVar37);
      auVar37 = vpandq_avx512vl(auVar51,auVar45);
      auVar38 = vpandq_avx512vl(auVar32,auVar45);
      auVar29 = vpandq_avx512vl(auVar27,auVar45);
      auVar47 = vpaddb_avx512vl(auVar38,auVar37);
      auVar37 = vpand_avx2(auVar16,auVar45);
      auVar38 = vpandq_avx512vl(auVar34,auVar45);
      auVar22 = vpsrlw_avx2(auVar16,2);
      auVar32 = vpaddb_avx512vl(auVar37,auVar38);
      auVar16 = vpand_avx2(auVar33,auVar45);
      auVar37 = vpandq_avx512vl(auVar30,auVar45);
      auVar22 = vpand_avx2(auVar22,auVar45);
      auVar38 = vpsrlw_avx2(auVar33,2);
      auVar39 = vpaddb_avx512vl(auVar16,auVar37);
      auVar16 = vpand_avx2(auVar50,auVar45);
      auVar33 = vpand_avx2(auVar48,auVar45);
      auVar23 = vpand_avx2(auVar38,auVar45);
      auVar40 = vpaddb_avx512vl(auVar33,auVar16);
      auVar16 = vpand_avx2(auVar52,auVar45);
      auVar33 = vpand_avx2(auVar49,auVar45);
      auVar16 = vpaddb_avx2(auVar33,auVar16);
      auVar33 = vpand_avx2(auVar36,auVar45);
      auVar33 = vpaddb_avx2(auVar25,auVar33);
      auVar37 = vpandq_avx512vl(auVar26,auVar45);
      auVar37 = vpaddb_avx2(auVar29,auVar37);
      auVar38 = vpsrlw_avx512vl(auVar31,2);
      auVar38 = vpand_avx2(auVar38,auVar45);
      auVar38 = vpaddb_avx2(auVar53,auVar38);
      auVar53 = vpsrlw_avx512vl(auVar51,2);
      auVar53 = vpand_avx2(auVar53,auVar45);
      auVar25 = vpaddb_avx512vl(auVar35,auVar53);
      auVar53 = vpsrlw_avx512vl(auVar34,2);
      auVar53 = vpand_avx2(auVar53,auVar45);
      auVar53 = vpaddb_avx2(auVar53,auVar22);
      auVar22 = vpsrlw_avx512vl(auVar30,2);
      auVar22 = vpand_avx2(auVar22,auVar45);
      auVar29 = vpaddb_avx512vl(auVar23,auVar22);
      auVar50 = vpsrlw_avx2(auVar50,2);
      auVar48 = vpsrlw_avx2(auVar48,2);
      auVar30 = vpandq_avx512vl(auVar25,auVar46);
      auVar50 = vpand_avx2(auVar50,auVar45);
      auVar48 = vpand_avx2(auVar48,auVar45);
      auVar31 = vpandq_avx512vl(auVar29,auVar46);
      auVar51 = vpaddb_avx512vl(auVar48,auVar50);
      auVar48 = vpsrlw_avx2(auVar49,2);
      auVar50 = vpsrlw_avx2(auVar52,2);
      auVar52 = vpsrlw_avx512vl(auVar47,4);
      auVar50 = vpand_avx2(auVar50,auVar45);
      auVar48 = vpand_avx2(auVar48,auVar45);
      auVar22 = vpand_avx2(auVar52,auVar46);
      auVar34 = vpaddb_avx512vl(auVar48,auVar50);
      auVar50 = vpsrlw_avx2(auVar36,2);
      auVar48 = vpsrlw_avx512vl(auVar24,2);
      auVar50 = vpand_avx2(auVar50,auVar45);
      auVar48 = vpand_avx2(auVar48,auVar45);
      auVar24 = vpandq_avx512vl(auVar34,auVar46);
      auVar50 = vpaddb_avx2(auVar48,auVar50);
      auVar48 = vpsrlw_avx512vl(auVar26,2);
      auVar52 = vpsrlw_avx512vl(auVar27,2);
      auVar49 = vpsrlw_avx512vl(auVar39,4);
      auVar48 = vpand_avx2(auVar48,auVar45);
      auVar52 = vpand_avx2(auVar52,auVar45);
      auVar26 = vpandq_avx512vl(auVar49,auVar46);
      auVar27 = vpaddb_avx512vl(auVar52,auVar48);
      auVar48 = vpandq_avx512vl(auVar28,auVar46);
      auVar52 = vpandq_avx512vl(auVar47,auVar46);
      auVar47 = vpaddb_avx512vl(auVar52,auVar48);
      auVar48 = vpandq_avx512vl(auVar32,auVar46);
      auVar52 = vpandq_avx512vl(auVar39,auVar46);
      auVar35 = vpaddb_avx512vl(auVar52,auVar48);
      auVar48 = vpand_avx2(auVar16,auVar46);
      auVar52 = vpandq_avx512vl(auVar40,auVar46);
      auVar49 = vpsrlw_avx2(auVar16,4);
      auVar39 = vpaddb_avx512vl(auVar48,auVar52);
      auVar16 = vpand_avx2(auVar33,auVar46);
      auVar48 = vpand_avx2(auVar37,auVar46);
      auVar52 = vpsrlw_avx2(auVar33,4);
      auVar36 = vpsrlw_avx2(auVar37,4);
      auVar23 = vpand_avx2(auVar49,auVar46);
      auVar16 = vpaddb_avx2(auVar48,auVar16);
      auVar33 = vpand_avx2(auVar38,auVar46);
      auVar48 = vpand_avx2(auVar52,auVar46);
      auVar52 = vpand_avx2(auVar36,auVar46);
      auVar33 = vpaddb_avx2(auVar30,auVar33);
      auVar49 = vpand_avx2(auVar53,auVar46);
      auVar48 = vpaddb_avx2(auVar52,auVar48);
      auVar38 = vpsrlw_avx2(auVar38,4);
      auVar36 = vpsrlw_avx512vl(auVar25,4);
      auVar52 = vpaddb_avx2(auVar31,auVar49);
      auVar37 = vpandq_avx512vl(auVar51,auVar46);
      auVar49 = vpand_avx2(auVar38,auVar46);
      auVar36 = vpand_avx2(auVar36,auVar46);
      auVar24 = vpaddb_avx512vl(auVar24,auVar37);
      auVar37 = vpand_avx2(auVar50,auVar46);
      auVar38 = vpandq_avx512vl(auVar27,auVar46);
      auVar49 = vpaddb_avx2(auVar36,auVar49);
      auVar36 = vpsrlw_avx2(auVar53,4);
      auVar53 = vpsrlw_avx512vl(auVar29,4);
      auVar29 = vpsrlw_avx2(auVar50,4);
      auVar50 = vpaddb_avx2(auVar38,auVar37);
      auVar25 = vpsrlw_avx512vl(auVar28,4);
      auVar36 = vpand_avx2(auVar36,auVar46);
      auVar37 = vpand_avx2(auVar53,auVar46);
      auVar38 = vpand_avx2(auVar29,auVar46);
      auVar53 = vpand_avx2(auVar25,auVar46);
      auVar36 = vpaddb_avx2(auVar37,auVar36);
      auVar25 = vpsrlw_avx512vl(auVar51,4);
      auVar28 = vpsrlw_avx512vl(auVar34,4);
      auVar37 = vpaddb_avx2(auVar22,auVar53);
      auVar22 = vpsrlw_avx512vl(auVar32,4);
      auVar53 = vpand_avx2(auVar25,auVar46);
      auVar25 = vpandq_avx512vl(auVar28,auVar46);
      auVar22 = vpand_avx2(auVar22,auVar46);
      auVar53 = vpaddb_avx512vl(auVar25,auVar53);
      auVar25 = vpsrlw_avx512vl(auVar27,4);
      auVar22 = vpaddb_avx512vl(auVar26,auVar22);
      auVar26 = vpsrlw_avx512vl(auVar40,4);
      auVar27 = vpbroadcastw_avx512vl(ZEXT216(0xf));
      auVar25 = vpandq_avx512vl(auVar25,auVar46);
      auVar38 = vpaddb_avx512vl(auVar25,auVar38);
      auVar25 = vpandq_avx512vl(auVar26,auVar46);
      auVar23 = vpaddb_avx512vl(auVar23,auVar25);
      auVar25 = vpandq_avx512vl(auVar47,auVar27);
      auVar26 = vpandq_avx512vl(auVar35,auVar27);
      auVar28 = vpandq_avx512vl(auVar16,auVar27);
      auVar29 = vpandq_avx512vl(auVar52,auVar27);
      auVar34 = vpsrlw_avx2(auVar52,8);
      auVar52 = vpandq_avx512vl(auVar50,auVar27);
      auVar40 = vpsrlw_avx2(auVar50,8);
      auVar30 = vpandq_avx512vl(auVar22,auVar27);
      auVar31 = vpandq_avx512vl(auVar48,auVar27);
      auVar32 = vpsrlw_avx2(auVar48,8);
      auVar50 = vpsrlw_avx512vl(auVar47,8);
      auVar48 = vpsrlw_avx512vl(auVar35,8);
      auVar47 = vpandq_avx512vl(auVar36,auVar27);
      auVar51 = vpsrlw_avx2(auVar16,8);
      auVar16 = vpaddb_avx512vl(auVar26,auVar25);
      auVar25 = vpandq_avx512vl(auVar39,auVar27);
      auVar26 = vpaddb_avx512vl(auVar48,auVar50);
      auVar50 = vpsrlw_avx512vl(auVar39,8);
      auVar17 = vmovdqa64_avx512vl(auVar17);
      auVar25 = vpaddb_avx512vl(auVar28,auVar25);
      auVar48 = vpandq_avx512vl(auVar33,auVar27);
      auVar33 = vpsrlw_avx2(auVar33,8);
      auVar28 = vpaddb_avx512vl(auVar51,auVar50);
      auVar18 = vmovdqa64_avx512vl(auVar18);
      auVar29 = vpaddb_avx512vl(auVar29,auVar48);
      auVar50 = vpandq_avx512vl(auVar24,auVar27);
      auVar33 = vpaddb_avx2(auVar34,auVar33);
      auVar48 = vpsrlw_avx512vl(auVar24,8);
      auVar24 = vmovdqa64_avx512vl(local_240);
      auVar52 = vpaddb_avx512vl(auVar52,auVar50);
      auVar51 = vpandq_avx512vl(auVar37,auVar27);
      auVar50 = vpaddb_avx2(auVar40,auVar48);
      auVar48 = vpsrlw_avx2(auVar37,8);
      auVar37 = vpsrlw_avx2(auVar22,8);
      auVar48 = vpaddb_avx2(auVar37,auVar48);
      auVar37 = vpaddb_avx512vl(auVar30,auVar51);
      auVar22 = vpandq_avx512vl(auVar23,auVar27);
      auVar30 = vpsrlw_avx2(auVar23,8);
      local_3e0 = vpaddw_avx512vl(local_3e0,auVar52);
      auVar22 = vpaddb_avx512vl(auVar31,auVar22);
      auVar23 = vpandq_avx512vl(auVar49,auVar27);
      auVar52 = vpaddb_avx2(auVar32,auVar30);
      auVar49 = vpsrlw_avx2(auVar49,8);
      auVar36 = vpsrlw_avx2(auVar36,8);
      auVar30 = vpsrlw_avx2(auVar38,8);
      auVar49 = vpaddb_avx2(auVar36,auVar49);
      auVar36 = vpsrlw_avx2(auVar53,8);
      auVar23 = vpaddb_avx512vl(auVar47,auVar23);
      auVar53 = vpandq_avx512vl(auVar53,auVar27);
      auVar38 = vpandq_avx512vl(auVar38,auVar27);
      auVar36 = vpaddb_avx2(auVar30,auVar36);
      auVar38 = vpaddb_avx512vl(auVar38,auVar53);
      auVar17 = vpaddw_avx512vl(auVar17,auVar25);
      auVar20 = vmovdqa64_avx512vl(auVar20);
      auVar18 = vpaddw_avx512vl(auVar18,auVar29);
      auVar19 = vmovdqa64_avx512vl(auVar19);
      auVar16 = vpaddw_avx512vl(auVar24,auVar16);
      auVar21 = vmovdqa64_avx512vl(auVar21);
      local_340 = vpaddw_avx512vl(local_340,auVar26);
      local_300 = vpaddw_avx2(local_300,auVar33);
      local_320 = vpaddw_avx2(local_320,auVar28);
      local_360 = vpaddw_avx512vl(local_360,auVar38);
      local_2e0 = vpaddw_avx2(local_2e0,auVar50);
      auVar20 = vpaddw_avx512vl(auVar20,auVar22);
      auVar19 = vpaddw_avx512vl(auVar19,auVar37);
      auVar21 = vpaddw_avx512vl(auVar21,auVar23);
      local_2a0 = vpaddw_avx2(local_2a0,auVar52);
      local_280 = vpaddw_avx2(local_280,auVar49);
      local_2c0 = vpaddw_avx2(local_2c0,auVar48);
      local_260 = vpaddw_avx2(auVar36,local_260);
    }
    local_440 = vmovdqa64_avx512vl(auVar16);
    local_420 = vmovdqa64_avx512vl(auVar17);
    local_400 = vmovdqa64_avx512vl(auVar18);
    local_3c0 = vmovdqa64_avx512vl(auVar19);
    local_3a0 = vmovdqa64_avx512vl(auVar20);
    local_380 = vmovdqa64_avx512vl(auVar21);
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      lVar15 = lVar10 * 0x20;
      local_80 = *(undefined8 *)(local_440 + lVar15);
      uStack_78 = *(undefined8 *)(local_440 + lVar15 + 8);
      uStack_70 = *(undefined8 *)(local_440 + lVar15 + 0x10);
      uStack_68 = *(undefined8 *)(local_420 + lVar15 + -8);
      uVar14 = flags[lVar10];
      for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
        uVar14 = uVar14 + *(ushort *)((long)&local_80 + lVar15 * 2);
      }
      flags[lVar10] = uVar14;
    }
    for (lVar10 = 0; lVar10 != 0x200; lVar10 = lVar10 + 0x20) {
      *(undefined8 *)(local_440 + lVar10) = 0;
      *(undefined8 *)(local_440 + lVar10 + 8) = 0;
      *(undefined8 *)(local_440 + lVar10 + 0x10) = 0;
      *(undefined8 *)(local_440 + lVar10 + 0x18) = 0;
    }
    puVar11 = puVar11 + 0x100000;
  }
  auVar16 = vmovdqa64_avx512vl(local_440);
  auVar17 = vmovdqa64_avx512vl(local_3c0);
  auVar18 = vmovdqa64_avx512vl(local_3a0);
  auVar19 = vmovdqa64_avx512vl(local_380);
  auVar21 = vmovdqa64_avx512vl(local_360);
  auVar33 = vmovdqa64_avx512vl(local_340);
  auVar50 = vmovdqa64_avx512vl(local_320);
  auVar20 = vmovdqa64_avx512vl(local_300);
  auVar48._8_2_ = 0xf;
  auVar48._0_8_ = 0xf000f000f000f;
  auVar48._10_2_ = 0xf;
  auVar48._12_2_ = 0xf;
  auVar48._14_2_ = 0xf;
  auVar48._16_2_ = 0xf;
  auVar48._18_2_ = 0xf;
  auVar48._20_2_ = 0xf;
  auVar48._22_2_ = 0xf;
  auVar48._24_2_ = 0xf;
  auVar48._26_2_ = 0xf;
  auVar48._28_2_ = 0xf;
  auVar48._30_2_ = 0xf;
  uVar13 = (ulong)(uVar3 << 0xc);
  uVar12 = (ulong)(uVar3 << 0x14);
  while (uVar13 < len >> 8) {
    local_460._8_8_ = local_260._8_8_;
    local_460._0_8_ = local_260._0_8_;
    local_460._16_8_ = local_260._16_8_;
    local_460._24_8_ = local_260._24_8_;
    pauVar1 = (undefined1 (*) [32])(array + uVar12);
    lVar10 = uVar12 + 0x10;
    local_240 = local_2a0;
    lVar15 = uVar12 + 0x20;
    lVar4 = uVar12 + 0x30;
    lVar5 = uVar12 + 0x40;
    lVar6 = uVar12 + 0x50;
    lVar7 = uVar12 + 0x60;
    lVar8 = uVar12 + 0x70;
    auVar16 = vmovdqa64_avx512vl(auVar16);
    lVar9 = uVar12 + 0x80;
    auVar24 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar12 + 0x90));
    auVar17 = vmovdqa64_avx512vl(auVar17);
    auVar18 = vmovdqa64_avx512vl(auVar18);
    auVar26 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar12 + 0xa0));
    auVar27 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar12 + 0xb0));
    auVar21 = vmovdqa64_avx512vl(auVar21);
    auVar28 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar12 + 0xc0));
    auVar29 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar12 + 0xd0));
    auVar30 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar12 + 0xe0));
    auVar31 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar12 + 0xf0));
    auVar33 = vmovdqa64_avx512vl(auVar33);
    auVar20 = vmovdqa64_avx512vl(auVar20);
    auVar50 = vmovdqa64_avx512vl(auVar50);
    auVar19 = vmovdqa64_avx512vl(auVar19);
    uVar13 = uVar13 + 1;
    uVar12 = uVar12 + 0x100;
    auVar52 = vpand_avx2(*pauVar1,auVar44);
    auVar49 = vpand_avx2(*(undefined1 (*) [32])(array + lVar10),auVar44);
    auVar36 = vpsrlw_avx2(*pauVar1,1);
    auVar37 = vpsrlw_avx2(*(undefined1 (*) [32])(array + lVar10),1);
    auVar47 = vpaddb_avx512vl(auVar49,auVar52);
    auVar52 = vpand_avx2(*(undefined1 (*) [32])(array + lVar15),auVar44);
    auVar49 = vpand_avx2(*(undefined1 (*) [32])(array + lVar4),auVar44);
    auVar36 = vpand_avx2(auVar36,auVar44);
    auVar37 = vpand_avx2(auVar37,auVar44);
    auVar51 = vpaddb_avx512vl(auVar49,auVar52);
    auVar52 = vpand_avx2(*(undefined1 (*) [32])(array + lVar5),auVar44);
    auVar49 = vpand_avx2(*(undefined1 (*) [32])(array + lVar6),auVar44);
    auVar32 = vpaddb_avx512vl(auVar49,auVar52);
    auVar52 = vpand_avx2(*(undefined1 (*) [32])(array + lVar7),auVar44);
    auVar49 = vpand_avx2(*(undefined1 (*) [32])(array + lVar8),auVar44);
    auVar34 = vpaddb_avx512vl(auVar49,auVar52);
    auVar52 = vpand_avx2(*(undefined1 (*) [32])(array + lVar9),auVar44);
    auVar49 = vpandq_avx512vl(auVar24,auVar44);
    auVar35 = vpaddb_avx512vl(auVar49,auVar52);
    auVar52 = vpandq_avx512vl(auVar26,auVar44);
    auVar49 = vpandq_avx512vl(auVar27,auVar44);
    auVar39 = vpaddb_avx512vl(auVar49,auVar52);
    auVar52 = vpandq_avx512vl(auVar28,auVar44);
    auVar49 = vpandq_avx512vl(auVar29,auVar44);
    auVar40 = vpaddb_avx512vl(auVar49,auVar52);
    auVar52 = vpandq_avx512vl(auVar30,auVar44);
    auVar49 = vpandq_avx512vl(auVar31,auVar44);
    auVar41 = vpaddb_avx512vl(auVar49,auVar52);
    auVar52 = vpaddb_avx2(auVar37,auVar36);
    auVar49 = vpsrlw_avx2(*(undefined1 (*) [32])(array + lVar15),1);
    auVar36 = vpsrlw_avx2(*(undefined1 (*) [32])(array + lVar4),1);
    auVar49 = vpand_avx2(auVar49,auVar44);
    auVar36 = vpand_avx2(auVar36,auVar44);
    auVar49 = vpaddb_avx2(auVar36,auVar49);
    auVar37 = vpsrlw_avx2(*(undefined1 (*) [32])(array + lVar6),1);
    auVar36 = vpsrlw_avx2(*(undefined1 (*) [32])(array + lVar5),1);
    auVar53 = vpsrlw_avx512vl(auVar51,2);
    auVar36 = vpand_avx2(auVar36,auVar44);
    auVar37 = vpand_avx2(auVar37,auVar44);
    auVar38 = vpand_avx2(auVar49,auVar45);
    auVar23 = vpsrlw_avx2(auVar49,2);
    auVar22 = vpand_avx2(auVar53,auVar45);
    auVar49 = vpaddb_avx2(auVar37,auVar36);
    auVar36 = vpsrlw_avx2(*(undefined1 (*) [32])(array + lVar7),1);
    auVar37 = vpsrlw_avx2(*(undefined1 (*) [32])(array + lVar8),1);
    auVar53 = vpand_avx2(auVar23,auVar45);
    auVar23 = vpsrlw_avx512vl(auVar34,2);
    auVar36 = vpand_avx2(auVar36,auVar44);
    auVar37 = vpand_avx2(auVar37,auVar44);
    auVar23 = vpand_avx2(auVar23,auVar45);
    auVar36 = vpaddb_avx2(auVar37,auVar36);
    auVar37 = vpsrlw_avx2(*(undefined1 (*) [32])(array + lVar9),1);
    auVar24 = vpsrlw_avx512vl(auVar24,1);
    auVar25 = vpsrlw_avx512vl(auVar39,2);
    auVar37 = vpand_avx2(auVar37,auVar44);
    auVar24 = vpand_avx2(auVar24,auVar44);
    auVar25 = vpand_avx2(auVar25,auVar45);
    auVar42 = vpaddb_avx512vl(auVar24,auVar37);
    auVar37 = vpsrlw_avx512vl(auVar26,1);
    auVar24 = vpsrlw_avx512vl(auVar27,1);
    auVar37 = vpand_avx2(auVar37,auVar44);
    auVar24 = vpand_avx2(auVar24,auVar44);
    auVar26 = vpaddb_avx512vl(auVar24,auVar37);
    auVar37 = vpsrlw_avx512vl(auVar28,1);
    auVar24 = vpsrlw_avx512vl(auVar29,1);
    auVar37 = vpand_avx2(auVar37,auVar44);
    auVar24 = vpand_avx2(auVar24,auVar44);
    auVar27 = vpandq_avx512vl(auVar26,auVar45);
    auVar28 = vpaddb_avx512vl(auVar24,auVar37);
    auVar37 = vpsrlw_avx512vl(auVar30,1);
    auVar24 = vpsrlw_avx512vl(auVar31,1);
    auVar37 = vpand_avx2(auVar37,auVar44);
    auVar24 = vpand_avx2(auVar24,auVar44);
    auVar29 = vpaddb_avx512vl(auVar24,auVar37);
    auVar37 = vpandq_avx512vl(auVar47,auVar45);
    auVar24 = vpandq_avx512vl(auVar51,auVar45);
    auVar30 = vpaddb_avx512vl(auVar24,auVar37);
    auVar37 = vpandq_avx512vl(auVar32,auVar45);
    auVar24 = vpandq_avx512vl(auVar34,auVar45);
    auVar31 = vpandq_avx512vl(auVar29,auVar45);
    auVar51 = vpaddb_avx512vl(auVar24,auVar37);
    auVar37 = vpandq_avx512vl(auVar35,auVar45);
    auVar24 = vpandq_avx512vl(auVar39,auVar45);
    auVar34 = vpaddb_avx512vl(auVar24,auVar37);
    auVar37 = vpandq_avx512vl(auVar40,auVar45);
    auVar24 = vpandq_avx512vl(auVar41,auVar45);
    auVar37 = vpaddb_avx2(auVar24,auVar37);
    auVar24 = vpand_avx2(auVar52,auVar45);
    auVar54 = vpsrlw_avx2(auVar52,2);
    auVar39 = vpaddb_avx512vl(auVar38,auVar24);
    auVar52 = vpand_avx2(auVar49,auVar45);
    auVar38 = vpand_avx2(auVar36,auVar45);
    auVar24 = vpand_avx2(auVar54,auVar45);
    auVar52 = vpaddb_avx2(auVar38,auVar52);
    auVar54 = vpandq_avx512vl(auVar42,auVar45);
    auVar38 = vpaddb_avx2(auVar53,auVar24);
    auVar53 = vpsrlw_avx2(auVar49,2);
    auVar24 = vpsrlw_avx2(auVar36,2);
    auVar36 = vpsrlw_avx512vl(auVar26,2);
    auVar43 = vpandq_avx512vl(auVar51,auVar46);
    auVar49 = vpaddb_avx2(auVar27,auVar54);
    auVar27 = vpandq_avx512vl(auVar28,auVar45);
    auVar53 = vpand_avx2(auVar53,auVar45);
    auVar24 = vpand_avx2(auVar24,auVar45);
    auVar26 = vpand_avx2(auVar36,auVar45);
    auVar36 = vpaddb_avx2(auVar31,auVar27);
    auVar27 = vpsrlw_avx512vl(auVar47,2);
    auVar53 = vpaddb_avx2(auVar24,auVar53);
    auVar24 = vpsrlw_avx512vl(auVar42,2);
    auVar29 = vpsrlw_avx512vl(auVar29,2);
    auVar31 = vpsrlw_avx512vl(auVar41,2);
    auVar47 = vmovdqa64_avx512vl(auVar19);
    auVar19 = vpand_avx2(auVar27,auVar45);
    auVar24 = vpand_avx2(auVar24,auVar45);
    auVar27 = vpandq_avx512vl(auVar29,auVar45);
    auVar29 = vpandq_avx512vl(auVar31,auVar45);
    auVar19 = vpaddb_avx2(auVar22,auVar19);
    auVar31 = vpsrlw_avx512vl(auVar32,2);
    auVar22 = vpaddb_avx2(auVar26,auVar24);
    auVar24 = vpsrlw_avx512vl(auVar28,2);
    auVar26 = vmovdqa64_avx512vl(auVar18);
    auVar18 = vpand_avx2(auVar31,auVar45);
    auVar24 = vpand_avx2(auVar24,auVar45);
    auVar18 = vpaddb_avx2(auVar23,auVar18);
    auVar23 = vpsrlw_avx512vl(auVar35,2);
    auVar27 = vpaddb_avx512vl(auVar27,auVar24);
    auVar28 = vpandq_avx512vl(auVar30,auVar46);
    auVar23 = vpand_avx2(auVar23,auVar45);
    auVar23 = vpaddb_avx2(auVar25,auVar23);
    auVar24 = vpsrlw_avx512vl(auVar40,2);
    auVar24 = vpand_avx2(auVar24,auVar45);
    auVar29 = vpaddb_avx512vl(auVar29,auVar24);
    auVar28 = vpaddb_avx512vl(auVar43,auVar28);
    auVar24 = vpandq_avx512vl(auVar37,auVar46);
    auVar25 = vpandq_avx512vl(auVar34,auVar46);
    auVar32 = vpsrlw_avx2(auVar37,4);
    auVar31 = vpaddb_avx512vl(auVar24,auVar25);
    auVar37 = vpandq_avx512vl(auVar52,auVar46);
    auVar25 = vpandq_avx512vl(auVar39,auVar46);
    auVar24 = vpand_avx2(auVar32,auVar46);
    auVar35 = vpsrlw_avx2(auVar52,4);
    auVar32 = vpaddb_avx512vl(auVar37,auVar25);
    auVar52 = vpandq_avx512vl(auVar49,auVar46);
    auVar37 = vpandq_avx512vl(auVar36,auVar46);
    auVar49 = vpsrlw_avx2(auVar49,4);
    auVar40 = vpsrlw_avx2(auVar36,4);
    auVar25 = vpand_avx2(auVar35,auVar46);
    auVar35 = vpaddb_avx512vl(auVar37,auVar52);
    auVar36 = vpandq_avx512vl(auVar19,auVar46);
    auVar37 = vpandq_avx512vl(auVar18,auVar46);
    auVar52 = vpand_avx2(auVar49,auVar46);
    auVar49 = vpand_avx2(auVar40,auVar46);
    auVar40 = vpaddb_avx512vl(auVar37,auVar36);
    auVar36 = vpandq_avx512vl(auVar23,auVar46);
    auVar37 = vpandq_avx512vl(auVar29,auVar46);
    auVar52 = vpaddb_avx2(auVar49,auVar52);
    auVar19 = vpsrlw_avx2(auVar19,4);
    auVar41 = vpsrlw_avx2(auVar18,4);
    auVar42 = vpsrlw_avx2(auVar29,4);
    auVar29 = vpaddb_avx512vl(auVar37,auVar36);
    auVar49 = vpandq_avx512vl(auVar38,auVar46);
    auVar36 = vpandq_avx512vl(auVar53,auVar46);
    auVar18 = vpand_avx2(auVar19,auVar46);
    auVar19 = vpand_avx2(auVar41,auVar46);
    auVar41 = vpsrlw_avx2(auVar38,4);
    auVar54 = vpsrlw_avx2(auVar53,4);
    auVar37 = vpand_avx2(auVar42,auVar46);
    auVar53 = vpaddb_avx512vl(auVar36,auVar49);
    auVar36 = vpandq_avx512vl(auVar22,auVar46);
    auVar38 = vpandq_avx512vl(auVar27,auVar46);
    auVar49 = vpaddb_avx2(auVar19,auVar18);
    auVar42 = vpsrlw_avx2(auVar23,4);
    auVar18 = vpand_avx2(auVar41,auVar46);
    auVar19 = vpand_avx2(auVar54,auVar46);
    auVar23 = vpaddb_avx512vl(auVar38,auVar36);
    auVar30 = vpsrlw_avx512vl(auVar30,4);
    auVar51 = vpsrlw_avx512vl(auVar51,4);
    auVar38 = vpand_avx2(auVar42,auVar46);
    auVar36 = vpaddb_avx2(auVar19,auVar18);
    auVar18 = vpsrlw_avx2(auVar22,4);
    auVar22 = vpandq_avx512vl(auVar31,auVar48);
    auVar19 = vpandq_avx512vl(auVar30,auVar46);
    auVar30 = vpandq_avx512vl(auVar51,auVar46);
    auVar37 = vpaddb_avx2(auVar37,auVar38);
    auVar51 = vpsrlw_avx2(auVar27,4);
    auVar18 = vpand_avx2(auVar18,auVar46);
    auVar27 = vpaddb_avx512vl(auVar30,auVar19);
    auVar38 = vpsrlw_avx512vl(auVar34,4);
    auVar19 = vpand_avx2(auVar51,auVar46);
    auVar30 = vmovdqa64_avx512vl(auVar17);
    auVar51 = vmovdqa64_avx512vl(auVar21);
    auVar17 = vpandq_avx512vl(auVar38,auVar46);
    auVar38 = vpaddb_avx2(auVar19,auVar18);
    auVar18 = vpandq_avx512vl(auVar28,auVar48);
    auVar19 = vpaddb_avx512vl(auVar24,auVar17);
    auVar21 = vpsrlw_avx512vl(auVar39,4);
    auVar17 = vpaddb_avx2(auVar22,auVar18);
    auVar18 = vpandq_avx512vl(auVar35,auVar48);
    auVar21 = vpandq_avx512vl(auVar21,auVar46);
    auVar22 = vpaddb_avx512vl(auVar25,auVar21);
    auVar16 = vmovdqa64_avx512vl(auVar16);
    auVar16 = vpaddw_avx512vl(auVar16,auVar17);
    auVar17 = vpandq_avx512vl(auVar32,auVar48);
    auVar17 = vpaddb_avx2(auVar18,auVar17);
    auVar18 = vpandq_avx512vl(auVar29,auVar48);
    local_420 = vpaddw_avx2(local_420,auVar17);
    auVar17 = vpandq_avx512vl(auVar40,auVar48);
    auVar17 = vpaddb_avx2(auVar18,auVar17);
    auVar18 = vpandq_avx512vl(auVar23,auVar48);
    local_400 = vpaddw_avx2(local_400,auVar17);
    auVar17 = vpandq_avx512vl(auVar53,auVar48);
    auVar17 = vpaddb_avx2(auVar18,auVar17);
    auVar18 = vpand_avx2(auVar19,auVar48);
    auVar34 = vpsrlw_avx2(auVar19,8);
    local_3e0 = vpaddw_avx2(local_3e0,auVar17);
    auVar17 = vpandq_avx512vl(auVar27,auVar48);
    auVar17 = vpaddb_avx2(auVar18,auVar17);
    auVar18 = vpand_avx2(auVar52,auVar48);
    auVar39 = vpsrlw_avx2(auVar52,8);
    auVar17 = vpaddw_avx512vl(auVar30,auVar17);
    auVar19 = vpand_avx2(auVar22,auVar48);
    auVar18 = vpaddb_avx2(auVar18,auVar19);
    auVar19 = vpand_avx2(auVar37,auVar48);
    auVar18 = vpaddw_avx512vl(auVar26,auVar18);
    auVar21 = vpand_avx2(auVar49,auVar48);
    auVar19 = vpaddb_avx2(auVar19,auVar21);
    auVar21 = vpand_avx2(auVar38,auVar48);
    auVar19 = vpaddw_avx512vl(auVar47,auVar19);
    auVar52 = vpand_avx2(auVar36,auVar48);
    auVar21 = vpaddb_avx2(auVar21,auVar52);
    auVar52 = vpsrlw_avx512vl(auVar31,8);
    auVar50 = vmovdqa64_avx512vl(auVar50);
    auVar21 = vpaddw_avx512vl(auVar51,auVar21);
    auVar24 = vpsrlw_avx512vl(auVar28,8);
    auVar25 = vmovdqa64_avx512vl(auVar33);
    auVar33 = vpaddb_avx2(auVar52,auVar24);
    auVar52 = vpsrlw_avx512vl(auVar35,8);
    auVar33 = vpaddw_avx512vl(auVar25,auVar33);
    auVar24 = vpsrlw_avx512vl(auVar32,8);
    auVar25 = vmovdqa64_avx512vl(auVar20);
    auVar20 = vpaddb_avx2(auVar52,auVar24);
    auVar52 = vpsrlw_avx512vl(auVar29,8);
    auVar50 = vpaddw_avx512vl(auVar50,auVar20);
    auVar20 = vpsrlw_avx512vl(auVar40,8);
    auVar20 = vpaddb_avx2(auVar52,auVar20);
    auVar52 = vpsrlw_avx512vl(auVar23,8);
    auVar20 = vpaddw_avx512vl(auVar25,auVar20);
    auVar53 = vpsrlw_avx512vl(auVar53,8);
    auVar52 = vpaddb_avx2(auVar52,auVar53);
    local_2e0 = vpaddw_avx2(local_2e0,auVar52);
    auVar52 = vpsrlw_avx512vl(auVar27,8);
    auVar52 = vpaddb_avx2(auVar52,auVar34);
    local_2c0 = vpaddw_avx2(local_2c0,auVar52);
    auVar52 = vpsrlw_avx2(auVar22,8);
    auVar52 = vpaddb_avx2(auVar39,auVar52);
    auVar37 = vpsrlw_avx2(auVar37,8);
    local_2a0 = vpaddw_avx2(local_2a0,auVar52);
    auVar52 = vpsrlw_avx2(auVar49,8);
    auVar52 = vpaddb_avx2(auVar37,auVar52);
    auVar49 = vpsrlw_avx2(auVar38,8);
    local_280 = vpaddw_avx2(local_280,auVar52);
    auVar52 = vpsrlw_avx2(auVar36,8);
    auVar52 = vpaddb_avx2(auVar49,auVar52);
    local_260 = vpaddw_avx2(local_460,auVar52);
    local_460._0_8_ = local_260._0_8_;
    local_460._8_8_ = local_260._8_8_;
    local_460._16_8_ = local_260._16_8_;
    local_460._24_8_ = local_260._24_8_;
    local_260._0_8_ = local_460._0_8_;
    local_260._8_8_ = local_460._8_8_;
    local_260._16_8_ = local_460._16_8_;
    local_260._24_8_ = local_460._24_8_;
  }
  local_440 = vmovdqa64_avx512vl(auVar16);
  local_3c0 = vmovdqa64_avx512vl(auVar17);
  local_3a0 = vmovdqa64_avx512vl(auVar18);
  local_380 = vmovdqa64_avx512vl(auVar19);
  local_360 = vmovdqa64_avx512vl(auVar21);
  local_340 = vmovdqa64_avx512vl(auVar33);
  local_320 = vmovdqa64_avx512vl(auVar50);
  local_300 = vmovdqa64_avx512vl(auVar20);
  for (; uVar12 < len; uVar12 = uVar12 + 1) {
    uVar2 = array[uVar12];
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      flags[lVar10] = flags[lVar10] + (uint)((uVar2 >> ((uint)lVar10 & 0x1f) & 1) != 0);
    }
  }
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
    lVar15 = lVar10 * 0x20;
    local_80 = *(undefined8 *)(local_440 + lVar15);
    uStack_78 = *(undefined8 *)(local_440 + lVar15 + 8);
    uStack_70 = *(undefined8 *)(local_440 + lVar15 + 0x10);
    uStack_68 = *(undefined8 *)(local_420 + lVar15 + -8);
    uVar14 = flags[lVar10];
    for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
      uVar14 = uVar14 + *(ushort *)((long)&local_80 + lVar15 * 2);
    }
    flags[lVar10] = uVar14;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_adder_forest(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m256i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm256_setzero_si256();
    }

    const __m256i mask1bit = _mm256_set1_epi16(0x5555); // 0101010101010101
    const __m256i mask2bit = _mm256_set1_epi16(0x3333); // 0011001100110011
    const __m256i mask4bit = _mm256_set1_epi16(0x0F0F); // 1111000011110000
    const __m256i mask8bit = _mm256_set1_epi16(0x00FF); // 0000000011111111
    
    const uint32_t n_cycles = len / (4096 * (16*16));
    const uint32_t n_total  = len / (16*16);
    uint16_t tmp[16];

/*------ Macros --------*/
#define LL(i,p,k)  const __m256i sum##p##k##_##i##bit_even = _mm256_add_epi8(input##p & mask##i##bit, input##k & mask##i##bit);
#define LO(i,p,k)  const __m256i sum##p##k##_##i##bit_odd  = _mm256_add_epi8(_mm256_srli_epi16(input##p, i) & mask##i##bit, _mm256_srli_epi16(input##k, i) & mask##i##bit);

#define LBLOCK(i)                                 \
    LL(i,0,1) LL(i,2,3)   LL(i,4,5)   LL(i,6,7)   \
    LL(i,8,9) LL(i,10,11) LL(i,12,13) LL(i,14,15) \
    LO(i,0,1) LO(i,2,3)   LO(i,4,5)   LO(i,6,7)   \
    LO(i,8,9) LO(i,10,11) LO(i,12,13) LO(i,14,15)

#define EVEN(b,i,k,p) input##i = sum##k##p##_##b##bit_even;
#define ODD(b,i,k,p)  input##i = sum##k##p##_##b##bit_odd;

#define UPDATE(i)                                                  \
    EVEN(i,0,0,1) EVEN(i,1,2,3)   EVEN(i,2,4,5)   EVEN(i,3,6,7)    \
    EVEN(i,4,8,9) EVEN(i,5,10,11) EVEN(i,6,12,13) EVEN(i,7,14,15)  \
     ODD(i,8,0,1)  ODD(i,9,2,3)    ODD(i,10,4,5)   ODD(i,11,6,7)   \
     ODD(i,12,8,9) ODD(i,13,10,11) ODD(i,14,12,13) ODD(i,15,14,15) \

#define UE(i,p,k) counters[i] = _mm256_add_epi16(counters[i], sum##p##k##_8bit_even);
#define UO(i,p,k) counters[i] = _mm256_add_epi16(counters[i], sum##p##k##_8bit_odd);

/*------ Start --------*/
#define L(p) __m256i input##p = _mm256_loadu_si256((__m256i*)(array + i*4096*256 + j*256 + p*16));
    size_t i = 0;
    for (/**/; i < n_cycles; ++i) {
        for (int j = 0; j < 4096; ++j) {
            // Load 16 registers.
            L(0)  L(1)  L(2)  L(3)  
            L(4)  L(5)  L(6)  L(7) 
            L(8)  L(9)  L(10) L(11) 
            L(12) L(13) L(14) L(15)

            // Perform updates for bits {1,2,4,8}.
            LBLOCK(1) UPDATE(1)
            LBLOCK(2) UPDATE(2)
            LBLOCK(4) UPDATE(4)
            LBLOCK(8) UPDATE(8)

            // Update accumulators.
            UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
            UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
            UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
            UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
        }

        // Update.
        for (size_t i = 0; i < 16; ++i) {
            _mm256_storeu_si256((__m256i*)tmp, counters[i]);
            for (int j = 0; j < 16; ++j)
                flags[i] += tmp[j];
        }
        // Reset.
        for (size_t i = 0; i < 16; ++i) {
            counters[i] = _mm256_setzero_si256();
        }
    }
#undef L
#define L(p) __m256i input##p = _mm256_loadu_si256((__m256i*)(array + i*256 + p*16));
    i *= 4096;
    for (/**/; i < n_total; ++i) {
        // Load 16 registers.
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

        // Perform updates for bits {1,2,4,8}.
        LBLOCK(1) UPDATE(1)
        LBLOCK(2) UPDATE(2)
        LBLOCK(4) UPDATE(4)
        LBLOCK(8) UPDATE(8)

        // Update accumulators.
        UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
        UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
        UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
        UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
    }

    i *= 256;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef UPDATE
#undef ODD
#undef EVEN
#undef LBLOCK
#undef LL
#undef LO
#undef UO
#undef UE

    for (size_t i = 0; i < 16; ++i) {
        _mm256_storeu_si256((__m256i*)tmp, counters[i]);
        for (int j = 0; j < 16; ++j)
            flags[i] += tmp[j];
    }
    return 0;
}